

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPrimal.cpp
# Opt level: O0

void __thiscall HPrimal::solvePhase2(HPrimal *this,HModel *ptr_model)

{
  double *pdVar1;
  int iVar2;
  int *piVar3;
  undefined8 in_RSI;
  HModel *in_RDI;
  double dVar4;
  HPrimal *this_00;
  double dVar5;
  HPrimal *in_stack_00000010;
  double lc_totalTime;
  HPrimal *in_stack_00000070;
  HPrimal *in_stack_000000a0;
  char *in_stack_ffffffffffffffc8;
  char *message;
  undefined8 in_stack_ffffffffffffffd8;
  int size_;
  HVector *in_stack_ffffffffffffffe0;
  int local_18;
  int local_14 [5];
  
  size_ = (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  *(undefined8 *)(in_RDI->intOption + 6) = in_RSI;
  iVar2 = HModel::getNumCol(*(HModel **)(in_RDI->intOption + 6));
  *(int *)in_RDI->dblOption = iVar2;
  iVar2 = HModel::getNumRow(*(HModel **)(in_RDI->intOption + 6));
  *(int *)((long)in_RDI->dblOption + 4) = iVar2;
  iVar2 = HModel::getNumTot(*(HModel **)(in_RDI->intOption + 6));
  *(int *)(in_RDI->dblOption + 1) = iVar2;
  printf(
        "************************************\nPerforming primal simplex iterations\n************************************\n"
        );
  local_14[0] = *(int *)((long)in_RDI->dblOption + 4) / 100 + 100;
  local_18 = 1000;
  piVar3 = std::min<int>(local_14,&local_18);
  *(int *)((long)in_RDI->dblOption + 0xc) = *piVar3;
  *(undefined4 *)(in_RDI->dblOption + 2) = 0;
  HVector::setup(in_stack_ffffffffffffffe0,size_);
  HVector::setup(in_stack_ffffffffffffffe0,size_);
  HVector::setup(in_stack_ffffffffffffffe0,size_);
  *(undefined8 *)&(in_RDI->timer).field_0x1f8 = 0;
  *(undefined8 *)&(in_RDI->timer).field_0x1f0 = 0;
  in_RDI->intOption[4] = 0;
  in_RDI->intOption[5] = 0;
  in_RDI->intOption[2] = 0;
  HModel::util_reportMessage(in_RDI,in_stack_ffffffffffffffc8);
  dVar5 = *(double *)(*(long *)(in_RDI->intOption + 6) + 0x568);
  dVar4 = HTimer::getTime((HTimer *)in_RDI);
  this_00 = (HPrimal *)(dVar5 + dVar4);
  do {
    primalRebuild(this_00);
    do {
      primalChooseColumn(in_stack_00000010);
      if (*(int *)(in_RDI->dblOption + 3) == -1) {
        *(undefined4 *)((long)in_RDI->dblOption + 0x14) = 3;
        goto LAB_00188c90;
      }
      primalChooseRow(in_stack_00000070);
      if (*(int *)((long)in_RDI->dblOption + 0x1c) == -1) {
        *(undefined4 *)((long)in_RDI->dblOption + 0x14) = 4;
        goto LAB_00188c90;
      }
      primalUpdate(in_stack_000000a0);
      if (*(int *)((long)in_RDI->dblOption + 0x14) != 0) goto LAB_00188c90;
      dVar5 = *(double *)(*(long *)(in_RDI->intOption + 6) + 0x590);
      pdVar1 = (double *)(*(long *)(in_RDI->intOption + 6) + 0x48);
    } while (dVar5 < *pdVar1 || dVar5 == *pdVar1);
    printf("HPrimal::solve_phase2: Objective = %g > %g = dblOption[DBLOPT_OBJ_UB]\n",
           *(undefined8 *)(*(long *)(in_RDI->intOption + 6) + 0x590),
           *(undefined8 *)(*(long *)(in_RDI->intOption + 6) + 0x48));
    *(undefined4 *)(*(long *)(in_RDI->intOption + 6) + 0x618) = 5;
LAB_00188c90:
    message = *(char **)(*(long *)(in_RDI->intOption + 6) + 0x568);
    dVar5 = HTimer::getTime((HTimer *)in_RDI);
    this_00 = (HPrimal *)((double)message + dVar5);
    if (*(double *)in_RDI->intOption <= (double)this_00 &&
        (double)this_00 != *(double *)in_RDI->intOption) {
      *(undefined4 *)(*(long *)(in_RDI->intOption + 6) + 0x618) = 6;
LAB_00188d18:
      if ((*(int *)(*(long *)(in_RDI->intOption + 6) + 0x618) != 6) &&
         (*(int *)(*(long *)(in_RDI->intOption + 6) + 0x618) != 5)) {
        if (*(int *)(in_RDI->dblOption + 3) == -1) {
          HModel::util_reportMessage(in_RDI,message);
          HModel::util_reportMessage(in_RDI,message);
          HModel::setProblemStatus(*(HModel **)(in_RDI->intOption + 6),0);
        }
        else {
          HModel::util_reportMessage(in_RDI,message);
          HModel::setProblemStatus(*(HModel **)(in_RDI->intOption + 6),2);
        }
      }
      return;
    }
    if ((*(int *)(*(long *)(in_RDI->intOption + 6) + 0x618) == 5) ||
       (*(int *)(*(long *)(in_RDI->intOption + 6) + 0x604) != 0)) goto LAB_00188d18;
  } while( true );
}

Assistant:

void HPrimal::solvePhase2(HModel *ptr_model) {
    // Copy size
    model = ptr_model;
    numCol = model->getNumCol();
    numRow = model->getNumRow();
    numTot = model->getNumTot();

#ifdef JAJH_dev
    printf("************************************\nPerforming primal simplex iterations\n************************************\n");
#endif
    // Setup update limits
    limitUpdate = min(100 + numRow / 100, 1000);
    countUpdate = 0;

    // Setup local vectors
    column.setup(numRow);
    row_ep.setup(numRow);
    row_ap.setup(numCol);
    columnDensity = 0;
    row_epDensity = 0;

    // Initialise rebuild count and time
    totalRebuildTime = 0;
    totalRebuilds = 0;

    // Setup other buffers

    model->util_reportMessage("primal-start");

    double lc_totalTime = model->totalTime + model->timer.getTime();

    // Main solving structure
    for (;;) {
        primalRebuild();

        for (;;) {
            primalChooseColumn();
            if (columnIn == -1) {
	      invertHint = invertHint_possiblyOptimal; 
	      break;
	    }
            primalChooseRow();
            if (rowOut == -1) {
	      invertHint = invertHint_possiblyPrimalUnbounded;
	      break;
            }
            primalUpdate();
            if (invertHint) {
	      break;
	    }
	    //	    printf("HPrimal::solve_phase2: Iter = %d; Objective = %g\n", model->numberIteration, model->objective);
	    if (model->objective > model->dblOption[DBLOPT_OBJ_UB]) {
#ifdef SCIP_dev
	      printf("HPrimal::solve_phase2: Objective = %g > %g = dblOption[DBLOPT_OBJ_UB]\n", model->objective, model->dblOption[DBLOPT_OBJ_UB]);
#endif
	      model->problemStatus = LP_Status_ObjUB;
	      break;
	    }
        }

	lc_totalTime = model->totalTime + model->timer.getTime();
	//	printf("Primal Ph2: lc_totalTime = %5.2f\n", lc_totalTime);
	if (lc_totalTime > TimeLimitValue) {
	  model->problemStatus = LP_Status_OutOfTime;
	  break;
	}
	if (model->problemStatus == LP_Status_ObjUB) break;
	// If the data are fresh from rebuild(), break out of
	// the outer loop to see what's ocurred
	// Was:	if (countUpdate == 0) break;
	if (model->mlFg_haveFreshRebuild) break;
    }

    if (model->problemStatus == LP_Status_OutOfTime || model->problemStatus == LP_Status_ObjUB) return;

    if (columnIn == -1) {
        model->util_reportMessage("primal-optimal");
        model->util_reportMessage("problem-optimal");
        model->setProblemStatus(LP_Status_Optimal);
    } else {
        model->util_reportMessage("primal-unbounded");
        model->setProblemStatus(LP_Status_Unbounded);
    }
}